

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

FILE * testing::internal::OpenFileForWriting(string *output_file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  _Alloc_hider _Var4;
  FILE *pFVar5;
  ostream *poVar6;
  _Alloc_hider _Var7;
  char cVar8;
  FilePath output_file_path;
  FilePath output_dir;
  GTestLog local_84;
  FilePath local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  long local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  FilePath local_40;
  
  pcVar2 = (output_file->_M_dataplus)._M_p;
  local_60 = &local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + output_file->_M_string_length);
  paVar1 = &local_80.pathname_.field_2;
  if (local_60 == &local_50) {
    local_80.pathname_.field_2._8_8_ = local_50._8_8_;
    local_80.pathname_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80.pathname_._M_dataplus._M_p = (pointer)local_60;
  }
  local_80.pathname_.field_2._M_allocated_capacity._1_7_ = local_50._M_allocated_capacity._1_7_;
  local_80.pathname_.field_2._M_local_buf[0] = local_50._M_local_buf[0];
  _Var4._M_p = local_80.pathname_._M_dataplus._M_p;
  _Var7._M_p = local_80.pathname_._M_dataplus._M_p;
  if (local_58 != 0) {
    do {
      cVar8 = *_Var7._M_p;
      if (((cVar8 != '/') || (cVar8 = '/', _Var4._M_p == local_80.pathname_._M_dataplus._M_p)) ||
         (_Var4._M_p[-1] != '/')) {
        *_Var4._M_p = cVar8;
        _Var4._M_p = _Var4._M_p + 1;
      }
      _Var7._M_p = _Var7._M_p + 1;
    } while (_Var7._M_p != local_80.pathname_._M_dataplus._M_p + local_58);
  }
  local_80.pathname_._M_string_length = (long)_Var4._M_p - (long)local_80.pathname_._M_dataplus._M_p
  ;
  *_Var4._M_p = '\0';
  local_50._M_local_buf[0] = '\0';
  local_58 = 0;
  local_60 = &local_50;
  FilePath::RemoveFileName(&local_40,&local_80);
  bVar3 = FilePath::CreateDirectoriesRecursively(&local_40);
  if (bVar3) {
    pFVar5 = fopen((output_file->_M_dataplus)._M_p,"w");
  }
  else {
    pFVar5 = (FILE *)0x0;
  }
  if (pFVar5 == (FILE *)0x0) {
    GTestLog::GTestLog(&local_84,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/todo-group[P]lattice/build_O1/_deps/googletest-src/googletest/src/gtest.cc"
                       ,0xdf);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to open file \"",0x15);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(output_file->_M_dataplus)._M_p,
                        output_file->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
    GTestLog::~GTestLog(&local_84);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.pathname_._M_dataplus._M_p != &local_40.pathname_.field_2) {
    operator_delete(local_40.pathname_._M_dataplus._M_p,
                    local_40.pathname_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.pathname_._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.pathname_._M_dataplus._M_p,
                    local_80.pathname_.field_2._M_allocated_capacity + 1);
  }
  return (FILE *)pFVar5;
}

Assistant:

static FILE* OpenFileForWriting(const std::string& output_file) {
  FILE* fileout = nullptr;
  FilePath output_file_path(output_file);
  FilePath output_dir(output_file_path.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    fileout = posix::FOpen(output_file.c_str(), "w");
  }
  if (fileout == nullptr) {
    GTEST_LOG_(FATAL) << "Unable to open file \"" << output_file << "\"";
  }
  return fileout;
}